

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  int iVar1;
  Table *pTab;
  char *in_RCX;
  long *in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int nCol;
  tRowcnt *aiRowEst;
  char *z;
  Table *pTable;
  Index *pIndex;
  analysisInfo *pInfo;
  Index fakeIdx;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff38;
  char *zDb;
  Index *pIndex_00;
  sqlite3 *db;
  Index *aOut;
  int nOut;
  undefined1 local_78 [92];
  LogEst local_1c;
  long local_8;
  
  nOut = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  zDb = &DAT_aaaaaaaaaaaaaaaa;
  if ((((in_RDX != (long *)0x0) && (*in_RDX != 0)) && (in_RDX[2] != 0)) &&
     (pTab = sqlite3FindTable((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,&DAT_aaaaaaaaaaaaaaaa,
                              in_stack_ffffffffffffff38), pTab != (Table *)0x0)) {
    if (in_RDX[1] == 0) {
      aOut = (Index *)0x0;
    }
    else {
      iVar1 = sqlite3_stricmp(in_stack_ffffffffffffff28,(char *)0x19e0e7);
      if (iVar1 == 0) {
        aOut = sqlite3PrimaryKeyIndex(pTab);
      }
      else {
        aOut = sqlite3FindIndex(db,(char *)pTab,zDb);
      }
    }
    pIndex_00 = (Index *)in_RDX[2];
    if (aOut == (Index *)0x0) {
      memset(local_78,0xaa,0x70);
      local_1c = pTab->szTabRow;
      decodeIntArray(in_RCX,nOut,(tRowcnt *)aOut,(LogEst *)pTab,pIndex_00);
      pTab->szTabRow = local_1c;
      pTab->tabFlags = pTab->tabFlags | 0x10;
    }
    else {
      *(ushort *)&aOut->field_0x63 = *(ushort *)&aOut->field_0x63 & 0xfffb;
      decodeIntArray(in_RCX,nOut,(tRowcnt *)aOut,(LogEst *)pTab,pIndex_00);
      *(ushort *)&aOut->field_0x63 = *(ushort *)&aOut->field_0x63 & 0xff7f | 0x80;
      if (aOut->pPartIdxWhere == (Expr *)0x0) {
        pTab->nRowLogEst = *aOut->aiRowLogEst;
        pTab->tabFlags = pTab->tabFlags | 0x10;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}